

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

void __thiscall FastPForLib::BitWidthHistoGram::display(BitWidthHistoGram *this,string *prefix)

{
  pointer pdVar1;
  pointer pdVar2;
  long lVar3;
  long lVar4;
  size_t k;
  ulong uVar5;
  double dVar6;
  
  pdVar1 = (this->histo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar2 = (this->histo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)pdVar1 - (long)pdVar2;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 3;
    dVar6 = 0.0;
    lVar4 = 0;
    do {
      dVar6 = dVar6 + pdVar2[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
    if (dVar6 != 0.0 && pdVar1 != pdVar2) {
      uVar5 = 0;
      do {
        printf("%s%zu %f\n",pdVar2[uVar5] / dVar6,(prefix->_M_dataplus)._M_p,uVar5);
        pdVar2 = (this->histo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)((long)(this->histo).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)pdVar2 >> 3));
    }
  }
  return;
}

Assistant:

void display(std::string prefix = "") {
    double sum = 0;
    for (size_t k = 0; k < histo.size(); ++k)
      sum += histo[k];
    if (sum == 0)
      return;
    for (size_t k = 0; k < histo.size(); ++k) {
      printf("%s%zu %f\n", prefix.c_str(), k, histo[k] / sum);
    }
  }